

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

mat<4UL,_4UL> *
operator*(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *lhs,mat<4UL,_4UL> *rhs)

{
  vec<4UL,_double> *pvVar1;
  double *pdVar2;
  double dVar3;
  vec<4UL,_double> local_48;
  size_t local_28;
  size_t j;
  size_t i;
  mat<4UL,_4UL> *rhs_local;
  mat<4UL,_4UL> *lhs_local;
  
  i = (size_t)rhs;
  rhs_local = lhs;
  mat<4UL,_4UL>::mat(__return_storage_ptr__);
  j = 4;
  while (j != 0) {
    local_28 = 4;
    j = j - 1;
    while (local_28 != 0) {
      local_28 = local_28 - 1;
      pvVar1 = mat<4UL,_4UL>::operator[](rhs_local,j);
      mat<4UL,_4UL>::col(&local_48,(mat<4UL,_4UL> *)i,local_28);
      dVar3 = dot<4ul,double>(pvVar1,&local_48);
      pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,j);
      pdVar2 = vec<4UL,_double>::operator[](pvVar1,local_28);
      *pdVar2 = dVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<R1, C2> operator*(const mat<R1, C1>& lhs, const mat<C1, C2>& rhs)
{
    mat<R1, C2> result;
    for (size_t i = R1; i--;)
        for (size_t j = C2; j--; result[i][j] = dot(lhs[i], rhs.col(j)))
            ;
    return result;
}